

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O3

void __thiscall SymbolData::addData(SymbolData *this,int64_t address,size_t size,DataType type)

{
  SymDataData data;
  SymDataData local_18;
  
  if (this->enabled == true) {
    local_18.address = address;
    local_18.size = size;
    local_18.type = type;
    std::
    _Rb_tree<SymDataData,SymDataData,std::_Identity<SymDataData>,std::less<SymDataData>,std::allocator<SymDataData>>
    ::_M_insert_unique<SymDataData_const&>
              ((_Rb_tree<SymDataData,SymDataData,std::_Identity<SymDataData>,std::less<SymDataData>,std::allocator<SymDataData>>
                *)&(this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>
                   ._M_impl.super__Vector_impl_data._M_start[this->currentModule].data,&local_18);
  }
  return;
}

Assistant:

void SymbolData::addData(int64_t address, size_t size, DataType type)
{
	if (!enabled)
		return;

	SymDataData data;
	data.address = address;
	data.size = size;
	data.type = type;
	modules[currentModule].data.insert(data);
}